

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportXMLBlob(string *xmlBlob,xmlNodePtr parent_element)

{
  char *__s;
  bool bVar1;
  _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *p_Var2;
  size_t sVar3;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *p_Var5;
  _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *p_Var6;
  _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *p_Var7;
  size_type sVar8;
  size_type sVar9;
  xmlNodePtr new_node;
  long local_38;
  
  local_38 = 0;
  p_Var2 = (_Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *)
           (xmlBlob->_M_dataplus)._M_p;
  sVar8 = xmlBlob->_M_string_length;
  p_Var7 = p_Var2 + sVar8;
  __it._M_current = (char *)parent_element;
  p_Var5 = p_Var2;
  sVar9 = sVar8;
  for (lVar4 = (long)sVar8 >> 2; p_Var6 = p_Var5, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5,__it);
    if (bVar1) goto LAB_00135af7;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5 + 1,__it);
    p_Var6 = p_Var5 + 1;
    if (bVar1) goto LAB_00135af7;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5 + 2,__it);
    p_Var6 = p_Var5 + 2;
    if (bVar1) goto LAB_00135af7;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5 + 3,__it);
    p_Var6 = p_Var5 + 3;
    if (bVar1) goto LAB_00135af7;
    p_Var5 = p_Var5 + 4;
    sVar9 = sVar9 - 4;
  }
  if (sVar9 == 1) {
LAB_00135ba0:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5,__it);
    p_Var6 = p_Var5;
    if (!bVar1) {
      p_Var6 = p_Var7;
    }
  }
  else if (sVar9 == 2) {
LAB_00135b8a:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5,__it);
    p_Var6 = p_Var5;
    if (!bVar1) {
      p_Var5 = p_Var5 + 1;
      goto LAB_00135ba0;
    }
  }
  else {
    if (sVar9 != 3) goto LAB_00135b31;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                      (p_Var5,__it);
    if (!bVar1) {
      p_Var5 = p_Var5 + 1;
      goto LAB_00135b8a;
    }
  }
LAB_00135af7:
  p_Var5 = p_Var6;
  if (p_Var6 != p_Var7) {
    while (p_Var5 = p_Var5 + 1, p_Var5 != p_Var7) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::$_0>::operator()
                        (p_Var5,__it);
      if (!bVar1) {
        *p_Var6 = *p_Var5;
        p_Var6 = p_Var6 + 1;
      }
    }
    p_Var2 = (_Iter_pred<iDynTree::exportXMLBlob(std::__cxx11::string,_xmlNode*)::__0> *)
             (xmlBlob->_M_dataplus)._M_p;
    sVar8 = xmlBlob->_M_string_length;
    p_Var7 = p_Var6;
  }
LAB_00135b31:
  std::__cxx11::string::erase(xmlBlob,p_Var7,p_Var2 + sVar8);
  __s = (xmlBlob->_M_dataplus)._M_p;
  sVar3 = strlen(__s);
  xmlParseInNodeContext(parent_element,__s,sVar3 & 0xffffffff,0,&local_38);
  if (local_38 != 0) {
    xmlAddChild(parent_element);
  }
  return true;
}

Assistant:

bool exportXMLBlob(std::string xmlBlob, xmlNodePtr parent_element) {
     xmlNodePtr new_node = nullptr;
     // Let's remove non printable characters
     xmlBlob.erase(std::remove_if(xmlBlob.begin(), xmlBlob.end(),
         [](unsigned char c) {
             return !std::isprint(c);
         }),
         xmlBlob.end());
    // we assume that 'parent_element' node is already defined
    xmlParseInNodeContext(parent_element, xmlBlob.c_str(), strlen(xmlBlob.c_str()), 0, &new_node);
    if (new_node) xmlAddChild(parent_element, new_node);
    return true;
}